

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O1

bool __thiscall raspicam::_private::Private_Impl::startCapture(Private_Impl *this)

{
  MMAL_STATUS_T MVar1;
  uint uVar2;
  MMAL_BUFFER_HEADER_T *buffer;
  ostream *poVar3;
  long *plVar4;
  uint uVar5;
  
  if (this->_isOpened == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private/private_impl.cpp"
               ,99);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x77);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"startCapture",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," not opened.",0xc);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  else {
    MVar1 = mmal_port_parameter_set_boolean(this->camera_video_port,0x10011,1);
    if (MVar1 == MMAL_SUCCESS) {
      uVar2 = mmal_queue_length(((this->State).video_pool)->queue);
      if (0 < (int)uVar2) {
        uVar5 = 0;
        do {
          buffer = mmal_queue_get(((this->State).video_pool)->queue);
          if (buffer == (MMAL_BUFFER_HEADER_T *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unable to get a required buffer",0x1f);
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,uVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," from pool queue",0x10);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
          }
          MVar1 = mmal_port_send_buffer(this->camera_video_port,buffer);
          if (MVar1 != MMAL_SUCCESS) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unable to send a buffer to encoder output port ",0x2f)
            ;
            plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,uVar5);
            std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
            std::ostream::put((char)plVar4);
            std::ostream::flush();
          }
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      this->_isCapturing = true;
      return true;
    }
    release(this);
  }
  return false;
}

Assistant:

bool Private_Impl::startCapture() {
            if ( !_isOpened ) {
                cerr<<__FILE__<<":"<<__LINE__<<":"<<__func__<<" not opened."<<endl;
                return false; //already opened
            }

            // start capture
            if ( mmal_port_parameter_set_boolean ( camera_video_port, MMAL_PARAMETER_CAPTURE, 1 ) != MMAL_SUCCESS ) {
                release();
                return false;
            }
            // Send all the buffers to the video port

            int num = mmal_queue_length ( State.video_pool->queue );
            int q;
            for ( q=0; q<num; q++ ) {
                MMAL_BUFFER_HEADER_T *buffer = mmal_queue_get ( State.video_pool->queue );

                if ( !buffer )
                    cerr<<"Unable to get a required buffer"<<q<<" from pool queue"<<endl;

                if ( mmal_port_send_buffer ( camera_video_port, buffer ) != MMAL_SUCCESS )
                    cerr<<"Unable to send a buffer to encoder output port "<< q<<endl;
            }
            _isCapturing=true;
            return true;
        }